

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cc
# Opt level: O3

int decode_dec(BIGNUM *bn,char *in,int in_len)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong w;
  
  if (0 < in_len) {
    iVar2 = 0x13 - (uint)in_len % 0x13;
    if ((uint)in_len % 0x13 == 0) {
      iVar2 = 0;
    }
    uVar3 = 0;
    w = 0;
    do {
      w = ((long)in[uVar3] + w * 10) - 0x30;
      iVar2 = iVar2 + 1;
      if (iVar2 == 0x13) {
        iVar2 = BN_mul_word((BIGNUM *)bn,10000000000000000000);
        if (iVar2 == 0) {
          return 0;
        }
        iVar1 = BN_add_word((BIGNUM *)bn,w);
        iVar2 = 0;
        if (iVar1 == 0) {
          return 0;
        }
        w = 0;
      }
      uVar3 = uVar3 + 1;
    } while ((uint)in_len != uVar3);
  }
  return 1;
}

Assistant:

static int decode_dec(BIGNUM *bn, const char *in, int in_len) {
  int i, j;
  BN_ULONG l = 0;

  // Decode |BN_DEC_NUM| digits at a time.
  j = BN_DEC_NUM - (in_len % BN_DEC_NUM);
  if (j == BN_DEC_NUM) {
    j = 0;
  }
  l = 0;
  for (i = 0; i < in_len; i++) {
    l *= 10;
    l += in[i] - '0';
    if (++j == BN_DEC_NUM) {
      if (!BN_mul_word(bn, BN_DEC_CONV) || !BN_add_word(bn, l)) {
        return 0;
      }
      l = 0;
      j = 0;
    }
  }
  return 1;
}